

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_view.cpp
# Opt level: O0

void ViewTrack_MFM_FM(Encoding encoding,BitBuffer *bitbuf)

{
  pointer *ppcVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int *piVar6;
  LogHelper *pLVar7;
  colour *pColours;
  int local_e0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int show_end;
  value_type local_87 [3];
  int show_begin;
  int local_80;
  int local_7c;
  int i_1;
  int i;
  uint8_t b;
  int iStack_70;
  bool found_am;
  uint16_t sync_mask;
  uint8_t am;
  int data_size;
  int am_dist;
  int a1;
  int bits;
  uint32_t dword;
  undefined1 local_50 [8];
  vector<colour,_std::allocator<colour>_> colours;
  Data track_data;
  int max_size;
  BitBuffer *bitbuf_local;
  Encoding encoding_local;
  
  bitbuf_local._4_4_ = encoding;
  iVar5 = BitBuffer::track_bitsize(bitbuf);
  iVar5 = (iVar5 * 0x6e) / 100;
  ppcVar1 = &colours.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  Data::Data((Data *)ppcVar1);
  std::vector<colour,_std::allocator<colour>_>::vector
            ((vector<colour,_std::allocator<colour>_> *)local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppcVar1,(long)iVar5);
  std::vector<colour,_std::allocator<colour>_>::reserve
            ((vector<colour,_std::allocator<colour>_> *)local_50,(long)iVar5);
  a1 = 0;
  am_dist = 0;
  data_size = 0;
  _sync_mask = 0xffff;
  iStack_70 = 0;
  i._3_1_ = 0;
  i._0_2_ = -(ushort)(opt.a1sync == 0) | 0xffdf;
  BitBuffer::seek(bitbuf,0);
LAB_001ee0e4:
  bVar3 = BitBuffer::wrapped(bitbuf);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    local_90 = 0;
    piVar6 = std::max<int>(&opt.bytes_begin,&local_90);
    show_end = *piVar6;
    if (opt.bytes_end < 0) {
      local_e0 = Data::size((Data *)&colours.super__Vector_base<colour,_std::allocator<colour>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      local_98 = Data::size((Data *)&colours.super__Vector_base<colour,_std::allocator<colour>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
      piVar6 = std::min<int>(&opt.bytes_end,&local_98);
      local_e0 = *piVar6;
    }
    local_94 = local_e0;
    if (show_end < local_e0) {
      pLVar7 = util::operator<<((LogHelper *)&util::cout,(Encoding *)((long)&bitbuf_local + 4));
      pLVar7 = util::operator<<(pLVar7,(char (*) [10])" Decode (");
      local_9c = BitBuffer::track_bitsize(bitbuf);
      pLVar7 = util::operator<<(pLVar7,&local_9c);
      util::operator<<(pLVar7,(char (*) [9])" bits):\n");
      ppcVar1 = &colours.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_a8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppcVar1);
      local_b8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppcVar1);
      local_b0 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_b8,(long)local_94);
      iVar5 = show_end;
      pColours = std::vector<colour,_std::allocator<colour>_>::data
                           ((vector<colour,_std::allocator<colour>_> *)local_50);
      util::
      hex_dump<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_a8,local_b0,iVar5,pColours,0x10);
    }
    std::vector<colour,_std::allocator<colour>_>::~vector
              ((vector<colour,_std::allocator<colour>_> *)local_50);
    Data::~Data((Data *)&colours.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    return;
  }
  uVar2 = a1 * 2;
  bVar4 = BitBuffer::read1(bitbuf);
  a1 = uVar2 | bVar4;
  am_dist = am_dist + 1;
  i_1._3_1_ = 0;
  if ((bitbuf_local._4_4_ == MFM) && ((a1 & (uint)(ushort)i) == 0x4489)) {
    i_1._3_1_ = 1;
  }
  else if ((bitbuf_local._4_4_ == FM) &&
          (((((a1 == 0xaa222888 || (a1 == 0xaa22288a)) || (a1 == 0xaa2228a8)) ||
            ((a1 == 0xaa2228aa || (a1 == 0xaa222a8a)))) ||
           ((a1 == 0xaa222aa8 || (a1 == 0xaa2a2a88)))))) {
    i_1._3_1_ = 1;
  }
  if (i_1._3_1_ == 0) goto code_r0x001ee205;
  goto LAB_001ee223;
code_r0x001ee205:
  iVar5 = 0x20;
  if (bitbuf_local._4_4_ == MFM) {
    iVar5 = 0x10;
  }
  if (am_dist == iVar5) {
LAB_001ee223:
    i_1._2_1_ = 0;
    if (bitbuf_local._4_4_ == MFM) {
      for (local_7c = 7; -1 < local_7c; local_7c = local_7c + -1) {
        i_1._2_1_ = i_1._2_1_ |
                    (byte)(((uint)a1 >> ((byte)(local_7c << 1) & 0x1f) & 1) <<
                          ((byte)local_7c & 0x1f));
      }
    }
    else {
      for (local_80 = 7; -1 < local_80; local_80 = local_80 + -1) {
        i_1._2_1_ = i_1._2_1_ |
                    (byte)(((uint)a1 >> ((char)(local_80 << 2) + 1U & 0x1f) & 1) <<
                          ((byte)local_80 & 0x1f));
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &colours.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type *)((long)&i_1 + 2));
    _sync_mask = _sync_mask + 1;
    if ((bitbuf_local._4_4_ == MFM) && ((i_1._3_1_ & 1) != 0)) {
      show_begin._3_1_ = (am_dist != 0x10) * -0x80 + -0x5f;
      std::vector<colour,_std::allocator<colour>_>::push_back
                ((vector<colour,_std::allocator<colour>_> *)local_50,
                 (value_type *)((long)&show_begin + 3));
      data_size = data_size + 1;
    }
    else {
      if ((i._3_1_ == 0xfe) && (_sync_mask == 4)) {
        iStack_70 = Sector::SizeCodeToLength((uint)i_1._2_1_);
      }
      if (data_size == 3) {
        show_begin._2_1_ = 0x9f;
        std::vector<colour,_std::allocator<colour>_>::push_back
                  ((vector<colour,_std::allocator<colour>_> *)local_50,
                   (value_type *)((long)&show_begin + 2));
        i._3_1_ = i_1._2_1_;
        _sync_mask = 0;
      }
      else if ((bitbuf_local._4_4_ == FM) && ((i_1._3_1_ & 1) != 0)) {
        show_begin._1_1_ = (am_dist != 0x20) * -0x80 + -0x61;
        std::vector<colour,_std::allocator<colour>_>::push_back
                  ((vector<colour,_std::allocator<colour>_> *)local_50,
                   (value_type *)((long)&show_begin + 1));
        i._3_1_ = i_1._2_1_;
        _sync_mask = 0;
      }
      else if ((i._3_1_ == 0xfe) && ((0 < _sync_mask && (_sync_mask < 5)))) {
        show_begin._0_1_ = (_sync_mask != 3) * -0x80 + -0x60;
        std::vector<colour,_std::allocator<colour>_>::push_back
                  ((vector<colour,_std::allocator<colour>_> *)local_50,(value_type *)&show_begin);
      }
      else if ((i._3_1_ == 0xfb) && ((0 < _sync_mask && (_sync_mask <= iStack_70)))) {
        local_87[2] = 0;
        std::vector<colour,_std::allocator<colour>_>::push_back
                  ((vector<colour,_std::allocator<colour>_> *)local_50,local_87 + 2);
      }
      else if (((i._3_1_ == 0xfe) && ((4 < _sync_mask && (_sync_mask < 7)))) ||
              ((i._3_1_ == 0xfb && ((iStack_70 < _sync_mask && (_sync_mask <= iStack_70 + 2)))))) {
        local_87[1] = 0xa3;
        std::vector<colour,_std::allocator<colour>_>::push_back
                  ((vector<colour,_std::allocator<colour>_> *)local_50,local_87 + 1);
      }
      else {
        local_87[0] = cyan;
        std::vector<colour,_std::allocator<colour>_>::push_back
                  ((vector<colour,_std::allocator<colour>_> *)local_50,local_87);
      }
      data_size = 0;
    }
    am_dist = 0;
  }
  goto LAB_001ee0e4;
}

Assistant:

void ViewTrack_MFM_FM(Encoding encoding, BitBuffer& bitbuf)
{
    auto max_size = bitbuf.track_bitsize() * 110 / 100;

    Data track_data;
    std::vector<colour> colours;
    track_data.reserve(max_size);
    colours.reserve(max_size);

    uint32_t dword = 0;
    int bits = 0, a1 = 0, am_dist = 0xffff, data_size = 0;
    uint8_t am = 0;
    uint16_t sync_mask = opt.a1sync ? 0xffdf : 0xffff;

    bitbuf.seek(0);
    while (!bitbuf.wrapped())
    {
        dword = (dword << 1) | bitbuf.read1();
        ++bits;

        bool found_am = false;
        if (encoding == Encoding::MFM && (dword & sync_mask) == 0x4489)
        {
            found_am = true;
        }
        else if (encoding == Encoding::FM)
        {
            switch (dword)
            {
            case 0xaa222888:    // F8/C7 DDAM
            case 0xaa22288a:    // F9/C7 Alt-DDAM
            case 0xaa2228a8:    // FA/C7 Alt-DAM
            case 0xaa2228aa:    // FB/C7 DAM
            case 0xaa2a2a88:    // FC/D7 IAM
            case 0xaa222a8a:    // FD/C7 RX02 DAM
            case 0xaa222aa8:    // FE/C7 IDAM
                found_am = true;
                break;
            }
        }

        if (found_am || (bits == (encoding == Encoding::MFM ? 16 : 32)))
        {
            // Decode data byte.
            uint8_t b = 0;
            if (encoding == Encoding::MFM)
            {
                for (int i = 7; i >= 0; --i)
                    b |= static_cast<uint8_t>(((dword >> (i * 2)) & 1) << i);
            }
            else
            {
                for (int i = 7; i >= 0; --i)
                    b |= static_cast<uint8_t>(((dword >> (i * 4 + 1)) & 1) << i);
            }
            track_data.push_back(b);
            ++am_dist;

            if (encoding == Encoding::MFM && found_am)
            {
                // A1 sync byte (red if aligned to bitstream, magenta if not).
                colours.push_back((bits == 16) ? colour::YELLOW : colour::yellow);
                ++a1;
            }
            else
            {
                if (am == 0xfe && am_dist == 4)
                    data_size = Sector::SizeCodeToLength(b);

                if (a1 == 3)
                {
                    colours.push_back(colour::RED);
                    am = b;
                    am_dist = 0;
                }
                else if (encoding == Encoding::FM && found_am)
                {
                    colours.push_back((bits == 32) ? colour::RED : colour::red);
                    am = b;
                    am_dist = 0;
                }
                else if (am == 0xfe && am_dist >= 1 && am_dist <= 4)
                {
                    colours.push_back((am_dist == 3) ? colour::GREEN : colour::green);
                }
                else if (am == 0xfb && am_dist >= 1 && am_dist <= data_size)
                {
                    colours.push_back(colour::white);
                }
                else if ((am == 0xfe && am_dist > 4 && am_dist <= 6) ||
                    (am == 0xfb && am_dist > data_size&& am_dist <= (data_size + 2)))
                {
                    colours.push_back(colour::MAGENTA);
                }
                else
                {
                    colours.push_back(colour::grey);
                }

                a1 = 0;
            }

            bits = 0;
        }
    }

    auto show_begin = std::max(opt.bytes_begin, 0);
    auto show_end = (opt.bytes_end < 0) ? track_data.size() :
        std::min(opt.bytes_end, track_data.size());
    if (show_end > show_begin)
    {
        util::cout << encoding << " Decode (" << bitbuf.track_bitsize() << " bits):\n";
        util::hex_dump(track_data.begin(), track_data.begin() + show_end,
            show_begin, colours.data());
    }
}